

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O2

BindingAlias *
duckdb::Binding::GetAlias
          (BindingAlias *__return_storage_ptr__,string *explicit_alias,StandardEntry *entry)

{
  string local_30;
  
  if (explicit_alias->_M_string_length == 0) {
    BindingAlias::BindingAlias(__return_storage_ptr__,entry);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_30,(string *)explicit_alias);
    BindingAlias::BindingAlias(__return_storage_ptr__,&local_30);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

BindingAlias Binding::GetAlias(const string &explicit_alias, const StandardEntry &entry) {
	if (!explicit_alias.empty()) {
		return BindingAlias(explicit_alias);
	}
	// no explicit alias provided - generate from entry
	return BindingAlias(entry);
}